

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralConnection::~IfcStructuralConnection
          (IfcStructuralConnection *this)

{
  ~IfcStructuralConnection((IfcStructuralConnection *)&this[-1].field_0x38);
  return;
}

Assistant:

IfcStructuralConnection() : Object("IfcStructuralConnection") {}